

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

HdlcByte * __thiscall
HdlcAnalyzer::ProcessFlags(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  if (((this->mSettings)._M_ptr)->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    BitSyncProcessFlags(this);
    this->mReadingFrame = true;
    ReadByte(__return_storage_ptr__,this);
  }
  else {
    this->mReadingFrame = true;
    ByteAsyncProcessFlags(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ProcessFlags()
{
    HdlcByte addressByte;
    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        BitSyncProcessFlags();
        mReadingFrame = true;
        addressByte = ReadByte();
    }
    else
    {
        mReadingFrame = true;
        addressByte = ByteAsyncProcessFlags();
    }

    return addressByte;
}